

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_sound_thumbnail.cxx
# Opt level: O2

void __thiscall xray_re::xr_sound_thumbnail::save(xr_sound_thumbnail *this,xr_writer *w)

{
  uint local_24;
  
  xr_writer::w_chunk<unsigned_short>(w,0x810,&THM_VERSION_SOUNDPARAM);
  xr_writer::w_chunk<unsigned_int>(w,0x813,&local_24);
  xr_writer::open_chunk(w,0x1000);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1001);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1002);
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_sound_thumbnail::save(xr_writer& w) const
{
	w.w_chunk<uint16_t>(THM_CHUNK_VERSION, THM_VERSION_SOUNDPARAM);
	w.w_chunk<uint32_t>(THM_CHUNK_TYPE, THM_TYPE_SOUND);

	w.open_chunk(THM_CHUNK_SOUNDPARAM);
	w.w_float(quality);
	w.w_float(min_dist);
	w.w_float(max_dist);
	w.w_u32(game_type);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_VOLUME);
	w.w_float(base_volume);
	w.close_chunk();

	w.open_chunk(THM_CHUNK_SOUNDPARAM_AI);
	w.w_float(max_ai_dist);
	w.close_chunk();
}